

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ExprNodeNext_TERM(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  int iVar1;
  int iVar2;
  Fts5Iter *pIter_00;
  Fts5ExprPhrase *pFVar3;
  Fts5IndexIter *pFVar4;
  int iVar5;
  uint uVar6;
  Fts5Iter *pIter;
  
  pIter_00 = (Fts5Iter *)pNode->pNear->apPhrase[0]->aTerm[0].pIter;
  if (bFromValid == 0) {
    fts5MultiIterNext(pIter_00->pIndex,pIter_00,0,0);
    iVar5 = pIter_00->pIndex->rc;
    pIter_00->pIndex->rc = 0;
  }
  else {
    iVar5 = sqlite3Fts5IterNextFrom((Fts5IndexIter *)pIter_00,iFrom);
  }
  if ((iVar5 == 0) && ((pIter_00->base).bEof == '\0')) {
    pFVar3 = pNode->pNear->apPhrase[0];
    pFVar4 = pFVar3->aTerm[0].pIter;
    iVar1 = pFVar4->nData;
    iVar2 = pExpr->pConfig->eDetail;
    (pFVar3->poslist).n = iVar1;
    if (iVar2 == 0) {
      (pFVar3->poslist).p = pFVar4->pData;
    }
    pNode->iRowid = pFVar4->iRowid;
    uVar6 = (uint)(iVar1 == 0);
  }
  else {
    pNode->bEof = 1;
    uVar6 = 0;
  }
  pNode->bNomatch = uVar6;
  return iVar5;
}

Assistant:

static int fts5ExprNodeNext_TERM(
  Fts5Expr *pExpr, 
  Fts5ExprNode *pNode,
  int bFromValid,
  i64 iFrom
){
  int rc;
  Fts5IndexIter *pIter = pNode->pNear->apPhrase[0]->aTerm[0].pIter;

  assert( pNode->bEof==0 );
  if( bFromValid ){
    rc = sqlite3Fts5IterNextFrom(pIter, iFrom);
  }else{
    rc = sqlite3Fts5IterNext(pIter);
  }
  if( rc==SQLITE_OK && sqlite3Fts5IterEof(pIter)==0 ){
    rc = fts5ExprNodeTest_TERM(pExpr, pNode);
  }else{
    pNode->bEof = 1;
    pNode->bNomatch = 0;
  }
  return rc;
}